

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v5::format_system_error(v5 *this,buffer *out,int error_code,string_view message)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  iterator iVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  undefined4 in_register_00000014;
  uint __errnum;
  locale_ref __s;
  basic_buffer<char> *c;
  int iVar12;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_248;
  size_t sStack_238;
  ulong local_230;
  char local_228 [504];
  
  pcVar10 = message.data_;
  local_248.locale_.locale_ = local_228;
  local_248.out_.container = (basic_buffer<char> *)&PTR_grow_00124fc8;
  local_230 = 500;
  sStack_238 = 500;
  do {
    sVar8 = sStack_238;
    __s.locale_ = local_248.locale_.locale_;
    __errnum = (uint)out;
    pcVar6 = strerror_r(__errnum,(char *)local_248.locale_.locale_,sStack_238);
    if ((char *)__s.locale_ == pcVar6) {
      sVar7 = strlen((char *)__s.locale_);
      iVar12 = 0x22;
      if (sVar7 != sVar8 - 1) goto LAB_001191a0;
    }
    else {
LAB_001191a0:
      iVar12 = 0;
      __s.locale_ = pcVar6;
    }
    if (iVar12 == 0x22) {
      uVar1 = sStack_238 * 2;
      if (local_230 < uVar1) {
        (*(code *)(local_248.out_.container)->_vptr_basic_buffer)(&local_248,uVar1);
      }
      iVar12 = 0;
      bVar4 = true;
      sStack_238 = uVar1;
    }
    else {
      if (iVar12 == 0) {
        lVar2 = *(long *)(this + 0x10);
        pcVar6 = pcVar10 + lVar2;
        if (*(char **)(this + 0x18) < pcVar6) {
          (*(code *)**(undefined8 **)this)(this,pcVar6);
        }
        *(char **)(this + 0x10) = pcVar6;
        if (pcVar10 != (char *)0x0) {
          memmove((void *)(lVar2 + *(long *)(this + 8)),
                  (void *)CONCAT44(in_register_00000014,error_code),(size_t)pcVar10);
        }
        lVar2 = *(long *)(this + 0x10);
        uVar1 = lVar2 + 2;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this,uVar1);
        }
        *(ulong *)(this + 0x10) = uVar1;
        *(undefined2 *)(*(long *)(this + 8) + lVar2) = 0x203a;
        sVar8 = strlen((char *)__s.locale_);
        lVar2 = *(long *)(this + 0x10);
        uVar1 = lVar2 + sVar8;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this,uVar1);
        }
        *(ulong *)(this + 0x10) = uVar1;
        iVar12 = 1;
        if (sVar8 != 0) {
          memmove((void *)(lVar2 + *(long *)(this + 8)),__s.locale_,sVar8);
        }
      }
      else {
        iVar12 = 2;
      }
      bVar4 = false;
    }
    if (iVar12 != 0) {
      if (iVar12 == 2) {
        bVar4 = true;
      }
      local_248.out_.container = (basic_buffer<char> *)&PTR_grow_00124fc8;
      if ((char *)local_248.locale_.locale_ != local_228) {
        operator_delete(local_248.locale_.locale_,local_230);
      }
      if (bVar4) {
        *(undefined8 *)(this + 0x10) = 0;
        uVar9 = -__errnum;
        if (0 < (int)__errnum) {
          uVar9 = __errnum;
        }
        uVar11 = 0x1f;
        if ((uVar9 | 1) != 0) {
          for (; (uVar9 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = (uVar11 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
        local_248.locale_.locale_ = (void *)0x0;
        local_248.out_.container = (basic_buffer<char> *)this;
        if (pcVar10 <=
            (char *)(0x1ec - (((ulong)out >> 0x1f & 1) +
                             (ulong)((uVar11 - (uVar9 < *(uint *)(internal::basic_data<void>::
                                                                  ZERO_OR_POWERS_OF_10_32 +
                                                                 (ulong)uVar11 * 4))) + 1)))) {
          if (*(char **)(this + 0x18) < pcVar10) {
            (*(code *)**(undefined8 **)this)(this,pcVar10);
          }
          *(char **)(this + 0x10) = pcVar10;
          if (pcVar10 != (char *)0x0) {
            memmove(*(void **)(this + 8),(void *)CONCAT44(in_register_00000014,error_code),
                    (size_t)pcVar10);
          }
          iVar5.container = local_248.out_.container;
          sVar3 = (local_248.out_.container)->size_;
          uVar1 = sVar3 + 2;
          if ((local_248.out_.container)->capacity_ < uVar1) {
            (**(local_248.out_.container)->_vptr_basic_buffer)(local_248.out_.container,uVar1);
          }
          (iVar5.container)->size_ = uVar1;
          pcVar10 = (iVar5.container)->ptr_ + sVar3;
          pcVar10[0] = ':';
          pcVar10[1] = ' ';
        }
        iVar5.container = local_248.out_.container;
        sVar3 = (local_248.out_.container)->size_;
        uVar1 = sVar3 + 6;
        if ((local_248.out_.container)->capacity_ < uVar1) {
          (**(local_248.out_.container)->_vptr_basic_buffer)(local_248.out_.container,uVar1);
        }
        (iVar5.container)->size_ = uVar1;
        builtin_strncpy((iVar5.container)->ptr_ + sVar3,"error ",6);
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
        write_decimal<int>(&local_248,__errnum);
      }
      return;
    }
  } while( true );
}

Assistant:

FMT_FUNC void format_system_error(
    internal::buffer &out, int error_code, string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char *system_message = &buf[0];
      int result = safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }